

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FormatSamplesCase::init
          (FormatSamplesCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar3;
  undefined7 extraout_var;
  ContextInfo *pCVar4;
  undefined7 extraout_var_00;
  NotSupportedError *pNVar6;
  undefined7 extraout_var_01;
  bool bVar7;
  bool supportsES32;
  bool isTextureTarget;
  FormatSamplesCase *this_local;
  FormatSamplesCase *pFVar5;
  
  bVar7 = true;
  if (this->m_target != 0x9100) {
    bVar7 = this->m_target == 0x9102;
  }
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  pFVar5 = (FormatSamplesCase *)CONCAT71(extraout_var,bVar1);
  if ((!bVar1) && (pFVar5 = this, this->m_target == 0x9102)) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (pCVar4,"GL_OES_texture_storage_multisample_2d_array");
    pFVar5 = (FormatSamplesCase *)CONCAT71(extraout_var_00,bVar2);
    if (!bVar2) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "Test requires OES_texture_storage_multisample_2d_array extension or a context version equal or higher than 3.2"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                 ,0x4f);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (((!bVar1) && (bVar7)) && (pFVar5 = this, this->m_internalFormat == 0x8d48)) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar7 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_OES_texture_stencil8");
    pFVar5 = (FormatSamplesCase *)CONCAT71(extraout_var_01,bVar7);
    if (!bVar7) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "Test requires GL_OES_texture_stencil8 extension or a context version equal or higher than 3.2"
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                 ,0x53);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return (int)pFVar5;
}

Assistant:

void FormatSamplesCase::init (void)
{
	const bool isTextureTarget	=	(m_target == GL_TEXTURE_2D_MULTISAMPLE) ||
									(m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	const bool supportsES32		=	contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		TCU_THROW(NotSupportedError, "Test requires OES_texture_storage_multisample_2d_array extension or a context version equal or higher than 3.2");

	// stencil8 textures are not supported without GL_OES_texture_stencil8 extension
	if (!supportsES32 && isTextureTarget && m_internalFormat == GL_STENCIL_INDEX8 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_stencil8"))
		TCU_THROW(NotSupportedError, "Test requires GL_OES_texture_stencil8 extension or a context version equal or higher than 3.2");
}